

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

int png_xy_from_XYZ(png_xy *xy,png_XYZ *XYZ)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int divisor;
  int iVar8;
  
  iVar7 = XYZ->red_Y + XYZ->red_X + XYZ->red_Z;
  iVar3 = png_muldiv(&xy->redx,XYZ->red_X,100000,iVar7);
  uVar6 = 1;
  if (iVar3 != 0) {
    iVar3 = png_muldiv(&xy->redy,XYZ->red_Y,100000,iVar7);
    if (iVar3 != 0) {
      iVar3 = XYZ->red_X;
      iVar1 = XYZ->red_Y;
      divisor = XYZ->green_Y + XYZ->green_X + XYZ->green_Z;
      iVar4 = png_muldiv(&xy->greenx,XYZ->green_X,100000,divisor);
      if (iVar4 != 0) {
        iVar4 = png_muldiv(&xy->greeny,XYZ->green_Y,100000,divisor);
        if (iVar4 != 0) {
          iVar4 = XYZ->green_X;
          iVar2 = XYZ->green_Y;
          iVar8 = XYZ->blue_Y + XYZ->blue_X + XYZ->blue_Z;
          iVar5 = png_muldiv(&xy->bluex,XYZ->blue_X,100000,iVar8);
          if (iVar5 != 0) {
            iVar5 = png_muldiv(&xy->bluey,XYZ->blue_Y,100000,iVar8);
            if (iVar5 != 0) {
              iVar8 = divisor + iVar7 + iVar8;
              iVar7 = XYZ->blue_Y;
              iVar3 = png_muldiv(&xy->whitex,iVar3 + iVar4 + XYZ->blue_X,100000,iVar8);
              if (iVar3 != 0) {
                uVar6 = png_muldiv(&xy->whitey,iVar1 + iVar2 + iVar7,100000,iVar8);
                uVar6 = uVar6 ^ 1;
              }
            }
          }
        }
      }
    }
  }
  return uVar6;
}

Assistant:

static int
png_xy_from_XYZ(png_xy *xy, const png_XYZ *XYZ)
{
   png_int_32 d, dwhite, whiteX, whiteY;

   d = XYZ->red_X + XYZ->red_Y + XYZ->red_Z;
   if (png_muldiv(&xy->redx, XYZ->red_X, PNG_FP_1, d) == 0)
      return 1;
   if (png_muldiv(&xy->redy, XYZ->red_Y, PNG_FP_1, d) == 0)
      return 1;
   dwhite = d;
   whiteX = XYZ->red_X;
   whiteY = XYZ->red_Y;

   d = XYZ->green_X + XYZ->green_Y + XYZ->green_Z;
   if (png_muldiv(&xy->greenx, XYZ->green_X, PNG_FP_1, d) == 0)
      return 1;
   if (png_muldiv(&xy->greeny, XYZ->green_Y, PNG_FP_1, d) == 0)
      return 1;
   dwhite += d;
   whiteX += XYZ->green_X;
   whiteY += XYZ->green_Y;

   d = XYZ->blue_X + XYZ->blue_Y + XYZ->blue_Z;
   if (png_muldiv(&xy->bluex, XYZ->blue_X, PNG_FP_1, d) == 0)
      return 1;
   if (png_muldiv(&xy->bluey, XYZ->blue_Y, PNG_FP_1, d) == 0)
      return 1;
   dwhite += d;
   whiteX += XYZ->blue_X;
   whiteY += XYZ->blue_Y;

   /* The reference white is simply the sum of the end-point (X,Y,Z) vectors,
    * thus:
    */
   if (png_muldiv(&xy->whitex, whiteX, PNG_FP_1, dwhite) == 0)
      return 1;
   if (png_muldiv(&xy->whitey, whiteY, PNG_FP_1, dwhite) == 0)
      return 1;

   return 0;
}